

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void BenchElastic<4u>(string *PATH)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer ppbVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Data<4U> *pDVar9;
  WavingSketch<8U,_1U,_4U> *this;
  ofstream *poVar10;
  ostream *poVar11;
  uint *puVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  key_type *__k;
  pointer ppbVar15;
  basic_ostream<char,_std::char_traits<char>_> **out;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  double dVar22;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  bool is_hit;
  count_type cnt;
  pair<unsigned_int,_Data<4U>_> p;
  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  topk_items;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  HashMap<4U> mp;
  queue<bool,_std::deque<bool,_std::allocator<bool>_>_> hits [1];
  vector<unsigned_int,_std::allocator<unsigned_int>_> total;
  string file;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchElastic\n\x1b[0m");
  cnt = 0;
  std::__cxx11::string::string((string *)&file,"caida",(allocator *)hits);
  pDVar9 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
  dVar17 = (double)cnt;
  this = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
  WavingSketch<8U,_1U,_4U>::WavingSketch(this,0x4000);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&outs,6,(allocator_type *)hits);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_ARE.csv"
                );
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  *outs.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_CR.csv")
  ;
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_PR.csv")
  ;
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_F1.csv")
  ;
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_HR.csv")
  ;
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[4] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  poVar10 = (ofstream *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &RESULT_FOLDER_abi_cxx11_,"elasticExpand_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&topk_items,
                 &file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hits,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_MEM.csv"
                );
  std::ofstream::ofstream(poVar10,(string *)hits,_S_out);
  iVar6 = (int)(dVar17 * 0.005);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[5] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar10;
  std::__cxx11::string::~string((string *)hits);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&topk_items);
  ppbVar5 = outs.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar15 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppbVar15 != ppbVar5;
      ppbVar15 = ppbVar15 + 1) {
    poVar11 = std::operator<<((ostream *)*ppbVar15,"MEM(KB)");
    poVar11 = std::operator<<(poVar11,",");
    poVar11 = std::operator<<(poVar11,(string *)&(this->super_Abstract<4U>).name);
    std::operator<<(poVar11,",");
    std::endl<char,std::char_traits<char>>((ostream *)*ppbVar15);
  }
  std::queue<bool,std::deque<bool,std::allocator<bool>>>::
  queue<std::deque<bool,std::allocator<bool>>,void>(hits);
  mp._M_h._M_buckets = (__buckets_ptr)((ulong)mp._M_h._M_buckets._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&total,1,(value_type_conflict1 *)&mp,(allocator_type *)&topk_items);
  mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
  mp._M_h._M_bucket_count = 1;
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mp._M_h._M_element_count = 0;
  mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mp._M_h._M_rehash_policy._M_next_resize = 0;
  mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
  topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &topk_items._M_t._M_impl.super__Rb_tree_header._M_header;
  topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  topk_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dVar17 = (double)iVar6;
  uVar16 = 0;
  topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((long)cnt <= (long)uVar16) {
      operator_delete(pDVar9,4);
      std::
      _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
      ::~_Rb_tree(&topk_items._M_t);
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&mp._M_h);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&total.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base
                ((_Deque_base<bool,_std::allocator<bool>_> *)hits);
      std::
      _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ::~_Vector_base(&outs.
                       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     );
      std::__cxx11::string::~string((string *)&file);
      return;
    }
    __k = pDVar9 + uVar16;
    puVar12 = (uint *)std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&mp,__k);
    p.first = *puVar12;
    p.second.str = *&__k->str;
    iVar13 = std::
             _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
             ::find(&topk_items._M_t,&p);
    if ((_Rb_tree_header *)iVar13._M_node != &topk_items._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
      ::erase(&topk_items._M_t,&p);
    }
    pmVar14 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&mp,__k);
    *pmVar14 = *pmVar14 + 1;
    puVar12 = (uint *)std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&mp,__k);
    p.first = *puVar12;
    p.second.str = *&__k->str;
    std::
    _Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
    ::_M_insert_equal<std::pair<unsigned_int,Data<4u>>const&>
              ((_Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
                *)&topk_items,&p);
    if (1000 < topk_items._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
                          *)&topk_items,
                         (const_iterator)
                         topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    }
    iVar7 = (*(this->super_Abstract<4U>)._vptr_Abstract[3])(this,__k);
    is_hit = iVar7 != 0;
    std::deque<bool,_std::allocator<bool>_>::push_back(&hits[0].c,&is_hit);
    *total.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start =
         *total.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start + (uint)is_hit;
    (**(this->super_Abstract<4U>)._vptr_Abstract)(this,__k);
    if ((long)iVar6 <= (long)uVar16) {
      *total.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start =
           *total.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start -
           (uint)*hits[0].c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
      std::deque<bool,_std::allocator<bool>_>::pop_front(&hits[0].c);
    }
    if ((uVar16 != 0) &&
       ((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) % (long)iVar6
             ) == 0)) {
      std::operator<<((ostream *)&std::cout,"checkpoint= ");
      dVar22 = (double)(int)uVar16;
      poVar11 = std::ostream::_M_insert<double>((dVar22 / (double)cnt) * 100.0);
      poVar11 = std::operator<<(poVar11," %");
      std::endl<char,std::char_traits<char>>(poVar11);
      ppbVar5 = outs.
                super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppbVar15 = outs.
                      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppbVar15 != ppbVar5;
          ppbVar15 = ppbVar15 + 1) {
        poVar11 = std::ostream::_M_insert<double>(dVar22 / (double)cnt);
        std::operator<<(poVar11,",");
      }
      WavingSketch<8U,_1U,_4U>::Check
                (this,&mp,topk_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                          _M_color,&outs);
      auVar1._8_8_ = in_XMM2_Qb;
      auVar1._0_8_ = in_XMM2_Qa;
      auVar1 = vcvtusi2sd_avx512f(auVar1,*total.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
      poVar11 = std::ostream::_M_insert<double>(auVar1._0_8_ / dVar17);
      std::operator<<(poVar11,",");
      auVar18._0_8_ = std::log2<unsigned_int>((this->BUCKET_NUM * 0x42) / 1000);
      auVar18._8_56_ = extraout_var;
      auVar1 = vroundsd_avx(auVar18._0_16_,auVar18._0_16_,9);
      dVar22 = exp2(auVar1._0_8_);
      poVar11 = std::ostream::_M_insert<double>(dVar22 * 1000.0);
      std::operator<<(poVar11,",");
      std::operator<<((ostream *)&std::cout,"Hit Rate: ");
      auVar2._8_8_ = in_XMM2_Qb;
      auVar2._0_8_ = in_XMM2_Qa;
      auVar1 = vcvtusi2sd_avx512f(auVar2,*total.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
      poVar11 = std::ostream::_M_insert<double>(auVar1._0_8_ / dVar17);
      std::operator<<(poVar11," Mem: ");
      auVar19._0_8_ = std::log2<unsigned_int>((this->BUCKET_NUM * 0x42) / 1000);
      auVar19._8_56_ = extraout_var_00;
      auVar1 = vroundsd_avx(auVar19._0_16_,auVar19._0_16_,9);
      dVar22 = exp2(auVar1._0_8_);
      poVar11 = std::ostream::_M_insert<double>(dVar22);
      poVar11 = std::operator<<(poVar11," KB");
      std::endl<char,std::char_traits<char>>(poVar11);
      uVar8 = this->BUCKET_NUM * 0x42;
      if (uVar8 < 0x108000) {
        auVar3._8_8_ = in_XMM2_Qb;
        auVar3._0_8_ = in_XMM2_Qa;
        auVar1 = vcvtusi2sd_avx512f(auVar3,*total.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        if (auVar1._0_8_ < dVar17 * 0.732) {
          WavingSketch<8U,_1U,_4U>::expand(this);
          poVar11 = std::operator<<((ostream *)&std::cout,"ID=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
          std::operator<<(poVar11," expand to ");
          auVar20._0_8_ = std::log2<unsigned_int>((this->BUCKET_NUM * 0x42) / 1000);
          auVar20._8_56_ = extraout_var_01;
          auVar1 = vroundsd_avx(auVar20._0_16_,auVar20._0_16_,9);
          dVar22 = exp2(auVar1._0_8_);
          poVar11 = std::ostream::_M_insert<double>(dVar22);
          poVar11 = std::operator<<(poVar11,"KB");
          std::endl<char,std::char_traits<char>>(poVar11);
          uVar8 = this->BUCKET_NUM * 0x42;
        }
        ppbVar15 = outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppbVar5 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (0x8400 < uVar8) goto LAB_00107587;
      }
      else {
LAB_00107587:
        auVar4._8_8_ = in_XMM2_Qb;
        auVar4._0_8_ = in_XMM2_Qa;
        auVar1 = vcvtusi2sd_avx512f(auVar4,*total.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        ppbVar15 = outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppbVar5 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (dVar17 * 0.768 < auVar1._0_8_) {
          WavingSketch<8U,_1U,_4U>::shrink(this);
          poVar11 = std::operator<<((ostream *)&std::cout,"ID=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
          std::operator<<(poVar11," shrink to ");
          auVar21._0_8_ = std::log2<unsigned_int>((this->BUCKET_NUM * 0x42) / 1000);
          auVar21._8_56_ = extraout_var_02;
          auVar1 = vroundsd_avx(auVar21._0_16_,auVar21._0_16_,9);
          dVar22 = exp2(auVar1._0_8_);
          poVar11 = std::ostream::_M_insert<double>(dVar22);
          poVar11 = std::operator<<(poVar11,"KB");
          std::endl<char,std::char_traits<char>>(poVar11);
          ppbVar15 = outs.
                     super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppbVar5 = outs.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; ppbVar15 != ppbVar5; ppbVar15 = ppbVar15 + 1) {
        std::endl<char,std::char_traits<char>>((ostream *)*ppbVar15);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void BenchElastic(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchElastic\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);

	constexpr int32_t memory_upper_bound = 1081344;
	constexpr int32_t memory_lower_bound = 16896 * 2;
	constexpr double hit_upper_bound = 0.768;
	constexpr double hit_lower_bound = 0.732;
	int32_t checkpoint = 0.005 * cnt;
	constexpr int32_t K = 1000;
	int output_pointer = 0;
	// constexpr int32_t num_inc = 10;
	int nshrink = 5;
	// constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 1;

	WavingSketch<8, 1, DATA_LEN>* sketches[cmp_num];

	sketches[0] = new WavingSketch<8, 1, DATA_LEN>(memory_upper_bound / (8 * 8 + 1 * 2));

	std::vector<std::ostream*> outs(6);
	outs[0] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_CR.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_PR.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_F1.csv");
	outs[4] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_HR.csv");
	outs[5] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_MEM.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << "," << sketches[0]->name << ",";
		*out << std::endl;
	}
	std::queue<bool> hits[cmp_num];
	std::vector<uint32_t> total(cmp_num, 0);
	HashMap<DATA_LEN> mp;
	std::multiset<std::pair<uint32_t, Data<DATA_LEN>>> topk_items;
	for (int l = 0; l < cnt; ++l) {
		std::pair<uint32_t, Data<DATA_LEN>> p = std::make_pair(mp[items[l]], items[l]);
		if (topk_items.find(p) != topk_items.end())
		{
			topk_items.erase(p);
		}
		mp[items[l]] += 1;
		p = std::make_pair(mp[items[l]], items[l]);
		topk_items.insert(p);
		if (topk_items.size() > K)
		{
			topk_items.erase(topk_items.begin());
		}
		for (int j = 0; j < cmp_num; ++j) {
			bool is_hit = sketches[j]->QueryTopK(items[l]) != 0;
			hits[j].push(is_hit);
			total[j] += is_hit;
			sketches[j]->Init(items[l]);
			if (l >= checkpoint)
			{
				total[j] -= hits[j].front();
				hits[j].pop();
			}
		}
		if (l % checkpoint == 0 && l)// checkpoint=1 when slide window
		{
			std::cout << "checkpoint= " << l * 1.0 / cnt * 100 << " %" << std::endl;
			for (auto& out : outs)
			{
				*out << l * 1.0 / cnt << ",";
			}
			for (int j = 0; j < cmp_num; j++)
			{
				uint32_t topK = topk_items.begin()->first;
				sketches[j]->Check(mp, topK, outs);
				*outs[4] << total[j] * 1.0 / checkpoint << ",";
				*outs[5] << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) * 1000 << ",";
				std::cout << "Hit Rate: " << total[j] * 1.0 / checkpoint
					<< " Mem: " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << " KB" << std::endl;

				if (sketches[j]->getMemSize() < memory_upper_bound
					&& total[j] < hit_lower_bound * checkpoint)
				{
					sketches[j]->expand();
					std::cout << "ID=" << j << " expand to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
				if (sketches[j]->getMemSize() > memory_lower_bound
					&& total[j] > hit_upper_bound * checkpoint)
				{
					sketches[j]->shrink();
					std::cout << "ID=" << j << " shrink to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
			}
			for (auto& out : outs)
			{
				*out << std::endl;
			}
			std::cout << std::endl;
		}
	}
	delete items;
}